

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eqclass.cc
# Opt level: O0

void __thiscall Eqclass::Eqclass(Eqclass *this,int iset_sz,int eqt)

{
  Lists<std::shared_ptr<Itemset>_> *pLVar1;
  int eqt_local;
  int iset_sz_local;
  Eqclass *this_local;
  
  std::shared_ptr<Lists<std::shared_ptr<Itemset>_>_>::shared_ptr(&this->theList);
  std::shared_ptr<Lists<std::shared_ptr<Itemset>_>_>::shared_ptr(&this->theList2);
  this->Iset_size = iset_sz;
  this->Eqtype = eqt;
  pLVar1 = (Lists<std::shared_ptr<Itemset>_> *)operator_new(0x28);
  Lists<std::shared_ptr<Itemset>_>::Lists(pLVar1);
  std::__shared_ptr<Lists<std::shared_ptr<Itemset>>,(__gnu_cxx::_Lock_policy)2>::
  reset<Lists<std::shared_ptr<Itemset>>>
            ((__shared_ptr<Lists<std::shared_ptr<Itemset>>,(__gnu_cxx::_Lock_policy)2> *)this,pLVar1
            );
  this->seqTemplate2 = 0;
  this->seqTemplate = 0;
  if (this->Eqtype == 1) {
    pLVar1 = (Lists<std::shared_ptr<Itemset>_> *)operator_new(0x28);
    Lists<std::shared_ptr<Itemset>_>::Lists(pLVar1);
    std::__shared_ptr<Lists<std::shared_ptr<Itemset>>,(__gnu_cxx::_Lock_policy)2>::
    reset<Lists<std::shared_ptr<Itemset>>>
              ((__shared_ptr<Lists<std::shared_ptr<Itemset>>,(__gnu_cxx::_Lock_policy)2> *)
               &this->theList2,pLVar1);
  }
  return;
}

Assistant:

Eqclass::Eqclass(int iset_sz, int eqt) {
    Iset_size = iset_sz;
    Eqtype = eqt;
    theList.reset(new Lists<shared_ptr<Itemset>>());
    seqTemplate = seqTemplate2 = 0;

    if (Eqtype == EQCTYP1) {
        theList2.reset(new Lists<shared_ptr<Itemset>>());
    }
}